

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O3

void print_usage(char *prg)

{
  fprintf(_stderr,"%s - convert ASC logfile to compact CAN frame logfile.\n",prg);
  fprintf(_stderr,"Usage: %s\n",prg);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("\t-I <infile>\t(default stdin)\n",0x1d,1,_stderr);
  fwrite("\t-O <outfile>\t(default stdout)\n",0x1f,1,_stderr);
  fwrite("\t-d (disable direction information R/T)\n",0x28,1,_stderr);
  fwrite("\t-v (verbose)\n",0xe,1,_stderr);
  return;
}

Assistant:

static void print_usage(char *prg)
{
	fprintf(stderr, "%s - convert ASC logfile to compact CAN frame logfile.\n", prg);
	fprintf(stderr, "Usage: %s\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "\t-I <infile>\t(default stdin)\n");
	fprintf(stderr, "\t-O <outfile>\t(default stdout)\n");
	fprintf(stderr, "\t-d (disable direction information R/T)\n");
	fprintf(stderr, "\t-v (verbose)\n");
}